

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equationofstateCmd.cpp
# Opt level: O0

void print_help_common(void)

{
  size_t sVar1;
  size_t sVar2;
  size_t len_usage;
  size_t len_purpose;
  
  sVar1 = strlen(gengetopt_args_info_purpose);
  sVar2 = strlen(gengetopt_args_info_usage);
  if (sVar2 != 0) {
    printf("%s\n",gengetopt_args_info_usage);
  }
  if (sVar1 != 0) {
    printf("%s\n",gengetopt_args_info_purpose);
  }
  if ((sVar2 != 0) || (sVar1 != 0)) {
    printf("\n");
  }
  sVar1 = strlen(gengetopt_args_info_description);
  if (sVar1 != 0) {
    printf("%s\n\n",gengetopt_args_info_description);
  }
  return;
}

Assistant:

static void print_help_common(void)
{
	size_t len_purpose = strlen(gengetopt_args_info_purpose);
	size_t len_usage = strlen(gengetopt_args_info_usage);

	if (len_usage > 0) {
		printf("%s\n", gengetopt_args_info_usage);
	}
	if (len_purpose > 0) {
		printf("%s\n", gengetopt_args_info_purpose);
	}

	if (len_usage || len_purpose) {
		printf("\n");
	}

	if (strlen(gengetopt_args_info_description) > 0) {
		printf("%s\n\n", gengetopt_args_info_description);
	}
}